

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.cpp
# Opt level: O2

void __thiscall duckdb::PartitionedColumnData::CreateAllocator(PartitionedColumnData *this)

{
  PartitionColumnDataAllocators *pPVar1;
  reference this_00;
  ColumnDataAllocator *pCVar2;
  shared_ptr<duckdb::ColumnDataAllocator,_true> sStack_28;
  
  pPVar1 = shared_ptr<duckdb::PartitionColumnDataAllocators,_true>::operator->(&this->allocators);
  BufferManager::GetBufferManager(this->context);
  make_shared_ptr<duckdb::ColumnDataAllocator,duckdb::BufferManager&>((BufferManager *)&sStack_28);
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnDataAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnDataAllocator,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::ColumnDataAllocator,true>>
            ((vector<duckdb::shared_ptr<duckdb::ColumnDataAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnDataAllocator,true>>>
              *)&pPVar1->allocators,&sStack_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_28.internal.
              super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pPVar1 = shared_ptr<duckdb::PartitionColumnDataAllocators,_true>::operator->(&this->allocators);
  this_00 = vector<duckdb::shared_ptr<duckdb::ColumnDataAllocator,_true>,_true>::back
                      (&pPVar1->allocators);
  pCVar2 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(this_00);
  pCVar2->shared = true;
  return;
}

Assistant:

void PartitionedColumnData::CreateAllocator() {
	allocators->allocators.emplace_back(make_shared_ptr<ColumnDataAllocator>(BufferManager::GetBufferManager(context)));
	allocators->allocators.back()->MakeShared();
}